

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__selector
          (ColladaParserAutoGen15Private *this)

{
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__selector()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__selector();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}